

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int bucketSort(uint *begin,uint *end)

{
  uint *puVar1;
  int i;
  long lVar2;
  bool bucket [280005];
  char acStack_445d8 [280008];
  
  memset(acStack_445d8,0,0x445c5);
  for (puVar1 = begin; puVar1 < end; puVar1 = puVar1 + 1) {
    acStack_445d8[*puVar1] = '\x01';
  }
  puVar1 = begin;
  for (lVar2 = 0; lVar2 != 0x445c5; lVar2 = lVar2 + 1) {
    if (acStack_445d8[lVar2] == '\x01') {
      *puVar1 = (uint)lVar2;
      puVar1 = puVar1 + 1;
    }
  }
  return (int)((ulong)((long)puVar1 - (long)begin) >> 2);
}

Assistant:

int bucketSort(unsigned int *begin, const unsigned int *end) {
    unsigned int *p = begin;
    const int MAXID = maxSize;
    bool bucket[MAXID];
    memset(bucket, 0, sizeof(bucket));
    for (; p < end; ++p) {
        bucket[*p] = true;
    }
    p = begin;
    for (int i = 0; i < MAXID; i++) {
        if (bucket[i]) {
            *p = i;
            ++p;
        }
    }
    return p - begin;
}